

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall NoteOffQueue::Heapify(NoteOffQueue *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  AutoNoteOff *pAVar4;
  AutoNoteOff *b;
  uint local_20;
  uint smallest;
  uint r;
  uint l;
  uint i;
  NoteOffQueue *this_local;
  
  r = 0;
  while( true ) {
    uVar1 = Left(this,r);
    uVar2 = Right(this,r);
    local_20 = r;
    uVar3 = TArray<AutoNoteOff,_AutoNoteOff>::Size(&this->super_TArray<AutoNoteOff,_AutoNoteOff>);
    if (uVar1 < uVar3) {
      pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)uVar1);
      uVar3 = pAVar4->Delay;
      pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)r);
      if (uVar3 < pAVar4->Delay) {
        local_20 = uVar1;
      }
    }
    uVar1 = TArray<AutoNoteOff,_AutoNoteOff>::Size(&this->super_TArray<AutoNoteOff,_AutoNoteOff>);
    if (uVar2 < uVar1) {
      pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)uVar2);
      uVar1 = pAVar4->Delay;
      pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_20);
      if (uVar1 < pAVar4->Delay) {
        local_20 = uVar2;
      }
    }
    if (local_20 == r) break;
    pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                       (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)r);
    b = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                  (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_20);
    swapvalues<AutoNoteOff>(pAVar4,b);
    r = local_20;
  }
  return;
}

Assistant:

void NoteOffQueue::Heapify()
{
	unsigned int i = 0;
	for (;;)
	{
		unsigned int l = Left(i);
		unsigned int r = Right(i);
		unsigned int smallest = i;
		if (l < Size() && (*this)[l].Delay < (*this)[i].Delay)
		{
			smallest = l;
		}
		if (r < Size() && (*this)[r].Delay < (*this)[smallest].Delay)
		{
			smallest = r;
		}
		if (smallest == i)
		{
			break;
		}
		swapvalues((*this)[i], (*this)[smallest]);
		i = smallest;
	}
}